

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::BlendConstantsTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::BlendConstantsTestInstance>
               *this,Context *context)

{
  char *vertexShaderName;
  DynamicStateBaseClass *this_00;
  mapped_type *ppcVar1;
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_01;
  RGBA local_8c;
  float local_88;
  float fStack_84;
  float afStack_80 [2];
  PositionColorVertex local_78;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_50;
  
  this_00 = (DynamicStateBaseClass *)operator_new(0x1a8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_50,&(this->m_shaderPaths)._M_t);
  local_78.position.m_data._0_8_ = (ulong)(uint)local_78.position.m_data[1] << 0x20;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_50,(key_type *)&local_78);
  vertexShaderName = *ppcVar1;
  local_88 = 1.4013e-45;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_50,(key_type *)&local_88);
  DynamicStateBaseClass::DynamicStateBaseClass(this_00,context,vertexShaderName,*ppcVar1);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DynamicStateBaseClass_00cfa998;
  this_00->m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  local_8c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_8c);
  this_01 = &this_00->m_data;
  local_78.position.m_data[0] = -1.0;
  local_78.position.m_data[1] = 1.0;
  local_78.position.m_data[2] = 1.0;
  local_78.position.m_data[3] = 1.0;
  local_78.color.m_data[1] = fStack_84;
  local_78.color.m_data[0] = local_88;
  local_78.color.m_data[2] = afStack_80[0];
  local_78.color.m_data[3] = afStack_80[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_78);
  local_8c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_8c);
  local_78.position.m_data[0] = 1.0;
  local_78.position.m_data[1] = 1.0;
  local_78.position.m_data[2] = 1.0;
  local_78.position.m_data[3] = 1.0;
  local_78.color.m_data[1] = fStack_84;
  local_78.color.m_data[0] = local_88;
  local_78.color.m_data[2] = afStack_80[0];
  local_78.color.m_data[3] = afStack_80[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_78);
  local_8c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_8c);
  local_78.position.m_data[0] = -1.0;
  local_78.position.m_data[1] = -1.0;
  local_78.position.m_data[2] = 1.0;
  local_78.position.m_data[3] = 1.0;
  local_78.color.m_data[1] = fStack_84;
  local_78.color.m_data[0] = local_88;
  local_78.color.m_data[2] = afStack_80[0];
  local_78.color.m_data[3] = afStack_80[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_78);
  local_8c.m_value = 0xff00ff00;
  tcu::RGBA::toVec(&local_8c);
  local_78.position.m_data[0] = 1.0;
  local_78.position.m_data[1] = -1.0;
  local_78.position.m_data[2] = 1.0;
  local_78.position.m_data[3] = 1.0;
  local_78.color.m_data[1] = fStack_84;
  local_78.color.m_data[0] = local_88;
  local_78.color.m_data[2] = afStack_80[0];
  local_78.color.m_data[3] = afStack_80[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_01,&local_78);
  DynamicStateBaseClass::initialize(this_00);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_50);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}